

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool pbrt::Atoi(string_view str,int *ptr)

{
  int iVar1;
  const_iterator __end;
  const_iterator __beg;
  int *in_RDX;
  size_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  basic_string_view<char,_std::char_traits<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_41 [33];
  int *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  this = &local_18;
  local_20 = in_RDX;
  __end = std::basic_string_view<char,_std::char_traits<char>_>::begin(this);
  __beg = std::basic_string_view<char,_std::char_traits<char>_>::end(this);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(this_00,__beg,__end,(allocator<char> *)this);
  iVar1 = std::__cxx11::stoi((string *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                             ,in_stack_ffffffffffffff78,0);
  *local_20 = iVar1;
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  return true;
}

Assistant:

bool Atoi(std::string_view str, int *ptr) {
    try {
        *ptr = std::stoi(std::string(str.begin(), str.end()));
    } catch (...) {
        return false;
    }
    return true;
}